

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O2

void __thiscall
vkt::drawutil::VulkanDrawContext::VulkanDrawContext
          (VulkanDrawContext *this,Context *context,DrawState *drawState,DrawCallData *drawCallData,
          VulkanProgram *vulkanProgram)

{
  MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *this_00;
  Move<vk::Handle<(vk::HandleType)18>_> *this_01;
  Move<vk::Handle<(vk::HandleType)24>_> *this_02;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  Allocation *pAVar1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar2;
  deUint64 dVar3;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *pvVar4;
  pointer pSVar5;
  PtrData<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> data;
  PtrData<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> data_00;
  PtrData<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> data_01;
  VkImageSubresourceRange subresourceRange;
  Move<vk::Handle<(vk::HandleType)23>_> *this_04;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar6;
  Move<vk::Handle<(vk::HandleType)16>_> *this_05;
  Move<vk::Handle<(vk::HandleType)13>_> *this_06;
  void *pvVar7;
  VkVertexInputBindingDescription *pVVar8;
  deUint32 queueFamilyIndex;
  int iVar9;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  ImageWithMemory *this_07;
  TextureFormat format;
  BufferWithMemory *pBVar10;
  VkPipelineTessellationStateCreateInfo *pVVar11;
  uint uVar12;
  ulong uVar13;
  size_t size;
  Move<vk::Handle<(vk::HandleType)14>_> *this_08;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 uVar14;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffffc24;
  undefined4 uVar16;
  VkBufferCreateInfo bufferCreateInfo_1;
  VkBufferCreateInfo bufferCreateInfo;
  VkDeviceSize zeroOffset;
  DeviceInterface *pDStack_280;
  VkDevice local_278;
  VkAllocationCallbacks *pVStack_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_250;
  Move<vk::Handle<(vk::HandleType)23>_> *local_248;
  Move<vk::Handle<(vk::HandleType)17>_> *local_240;
  Move<vk::Handle<(vk::HandleType)16>_> *local_238;
  Move<vk::Handle<(vk::HandleType)13>_> *local_230;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_228;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_1c8;
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  shaderStages;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  VkAttachmentReference colorAttachmentReference;
  VkImageView attachmentBindInfos [1];
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkAttachmentReference depthAttachmentReference;
  VkVertexInputBindingDescription bindingDesc;
  VkVertexInputAttributeDescription attributeDesc;
  VkRect2D scissor;
  VkViewport res;
  
  DrawContext::DrawContext(&this->super_DrawContext,drawState,drawCallData);
  (this->super_DrawContext)._vptr_DrawContext = (_func_int **)&PTR__VulkanDrawContext_00bf5460;
  this->m_context = context;
  (this->m_program).shaders = vulkanProgram->shaders;
  (this->m_colorImage).
  super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>.m_data.ptr =
       (ImageWithMemory *)0x0;
  this_00 = &this->m_colorAttachmentBuffer;
  (this->m_colorAttachmentBuffer).
  super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.m_data.ptr =
       (BufferWithMemory *)0x0;
  local_230 = &this->m_colorImageView;
  local_240 = &this->m_renderPass;
  local_248 = &this->m_framebuffer;
  local_238 = &this->m_pipelineLayout;
  this_01 = &this->m_pipeline;
  this_02 = &this->m_cmdPool;
  this_03 = &this->m_cmdBuffer;
  memset(local_230,0,0x188);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(this->m_context);
  allocator = Context::getDefaultAllocator(this->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this->m_context);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,
                  queueFamilyIndex);
  bufferCreateInfo_1.flags = bufferCreateInfo.flags;
  bufferCreateInfo_1._20_4_ = bufferCreateInfo._20_4_;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)bufferCreateInfo.size;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(bufferCreateInfo.size >> 0x20);
  bufferCreateInfo_1.sType = bufferCreateInfo.sType;
  bufferCreateInfo_1._4_4_ = bufferCreateInfo._4_4_;
  bufferCreateInfo_1.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo_1._16_8_;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo_1.size._4_4_,(VkFormat)bufferCreateInfo_1.size);
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       bufferCreateInfo_1._0_8_;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo_1.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
                    (VkCommandPool)
                    (this_02->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.
                    m_internal);
  bufferCreateInfo_1.flags = bufferCreateInfo.flags;
  bufferCreateInfo_1._20_4_ = bufferCreateInfo._20_4_;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)bufferCreateInfo.size;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(bufferCreateInfo.size >> 0x20);
  bufferCreateInfo_1.sType = bufferCreateInfo.sType;
  bufferCreateInfo_1._4_4_ = bufferCreateInfo._4_4_;
  bufferCreateInfo_1.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo_1._16_8_;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       CONCAT44(bufferCreateInfo_1.size._4_4_,(VkFormat)bufferCreateInfo_1.size);
  (this_03->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
       (VkCommandBuffer_s *)bufferCreateInfo_1._0_8_;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo_1.pNext;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo);
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 0;
  bufferCreateInfo_1._20_4_ = 1;
  bufferCreateInfo_1.size._0_4_ = (this->super_DrawContext).m_drawState.colorFormat;
  uVar14 = *(undefined8 *)(this->super_DrawContext).m_drawState.renderSize.m_data;
  bufferCreateInfo_1.size._4_4_ = (undefined4)uVar14;
  bufferCreateInfo_1.usage = (VkBufferUsageFlags)((ulong)uVar14 >> 0x20);
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_CONCURRENT;
  bufferCreateInfo_1.queueFamilyIndexCount = 1;
  bufferCreateInfo_1._44_4_ = 1;
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 0;
  this_07 = (ImageWithMemory *)operator_new(0x30);
  ::vk::ImageWithMemory::ImageWithMemory
            (this_07,vk,device,allocator,(VkImageCreateInfo *)&bufferCreateInfo_1,
             (MemoryRequirement)0x0);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  data._8_4_ = in_stack_fffffffffffffc20;
  data.ptr = (ImageWithMemory *)in_stack_fffffffffffffc18;
  data._12_4_ = in_stack_fffffffffffffc24;
  de::details::UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::assignData
            (&(this->m_colorImage).
              super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>,data);
  de::details::UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::
  ~UniqueBase((UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> *)
              &bufferCreateInfo);
  this_06 = local_230;
  uVar14 = 1;
  uVar15 = 1;
  uVar16 = 0;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&zeroOffset,vk,device,
                (VkImage)(((this->m_colorImage).
                           super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>
                           .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,
                (this->super_DrawContext).m_drawState.colorFormat,subresourceRange);
  bufferCreateInfo._16_8_ = local_278;
  bufferCreateInfo.size = (VkDeviceSize)pVStack_270;
  bufferCreateInfo._0_8_ = zeroOffset;
  bufferCreateInfo.pNext = pDStack_280;
  zeroOffset = 0;
  pDStack_280 = (DeviceInterface *)0x0;
  local_278 = (VkDevice)0x0;
  pVStack_270 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_06->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this_06->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  (this_06->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferCreateInfo.size;
  (this_06->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  (this_06->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&zeroOffset);
  format = ::vk::mapVkFormat((this->super_DrawContext).m_drawState.colorFormat);
  iVar9 = tcu::getPixelSize(format);
  uVar13 = (ulong)(iVar9 * (this->super_DrawContext).m_drawState.renderSize.m_data[0] *
                  (this->super_DrawContext).m_drawState.renderSize.m_data[1]);
  pBVar10 = (BufferWithMemory *)operator_new(0x30);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = bufferCreateInfo._16_8_ & 0xffffffff00000000;
  bufferCreateInfo.usage = 2;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo._40_8_ = (ulong)(uint)bufferCreateInfo._44_4_ << 0x20;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  bufferCreateInfo.size = uVar13;
  ::vk::BufferWithMemory::BufferWithMemory
            (pBVar10,vk,device,allocator,&bufferCreateInfo,(MemoryRequirement)0x1);
  zeroOffset = 0;
  data_00._8_4_ = uVar15;
  data_00.ptr = (BufferWithMemory *)uVar14;
  data_00._12_4_ = uVar16;
  de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::
  assignData(&this_00->
              super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>,
             data_00);
  de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::
  ~UniqueBase((UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *)
              &zeroOffset);
  pAVar1 = (((this_00->
             super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
             m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset(pAVar1->m_hostPtr,0,uVar13);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,uVar13);
  pvVar2 = (this->super_DrawContext).m_drawCallData.vertices;
  size = (long)(pvVar2->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(pvVar2->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
  pBVar10 = (BufferWithMemory *)operator_new(0x30);
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1._16_8_ = bufferCreateInfo_1._16_8_ & 0xffffffff00000000;
  bufferCreateInfo_1.usage = 0x80;
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 0;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo_1.size = size;
  ::vk::BufferWithMemory::BufferWithMemory
            (pBVar10,vk,device,allocator,&bufferCreateInfo_1,(MemoryRequirement)0x1);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  data_01._8_4_ = uVar15;
  data_01.ptr = (BufferWithMemory *)uVar14;
  data_01._12_4_ = uVar16;
  de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::
  assignData(&(this->m_vertexBuffer).
              super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>,
             data_01);
  de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::
  ~UniqueBase((UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *)
              &bufferCreateInfo);
  pAVar1 = (((this->m_vertexBuffer).
             super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
             m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memcpy(pAVar1->m_hostPtr,
         (((this->super_DrawContext).m_drawCallData.vertices)->
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)._M_impl
         .super__Vector_impl_data._M_start,size);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,size);
  this_05 = local_238;
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,vk,device);
  bufferCreateInfo_1.flags = bufferCreateInfo.flags;
  bufferCreateInfo_1._20_4_ = bufferCreateInfo._20_4_;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)bufferCreateInfo.size;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(bufferCreateInfo.size >> 0x20);
  bufferCreateInfo_1.sType = bufferCreateInfo.sType;
  bufferCreateInfo_1._4_4_ = bufferCreateInfo._4_4_;
  bufferCreateInfo_1.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            (&this_05->super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (this_05->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo_1._16_8_;
  (this_05->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo_1.size._4_4_,(VkFormat)bufferCreateInfo_1.size);
  (this_05->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       bufferCreateInfo_1._0_8_;
  (this_05->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo_1.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo);
  zeroOffset = (ulong)(this->super_DrawContext).m_drawState.colorFormat << 0x20;
  pDStack_280 = (DeviceInterface *)0x100000001;
  local_278 = (VkDevice)0x200000000;
  bufferCreateInfo_1._32_8_ = &colorAttachmentReference;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo_1._4_4_ = 0;
  bufferCreateInfo_1.pQueueFamilyIndices = &depthAttachmentReference.attachment;
  bufferCreateInfo_1.pNext = (void *)((ulong)bufferCreateInfo_1.pNext & 0xffffffff00000000);
  bufferCreateInfo_1.flags = 0;
  bufferCreateInfo_1._20_4_ = 0;
  bufferCreateInfo_1.size._0_4_ = 1;
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1._44_4_ = 0;
  pVStack_270 = (VkAllocationCallbacks *)0x1;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  local_268 = CONCAT44(local_268._4_4_,2);
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 1;
  bufferCreateInfo.size = (VkDeviceSize)&zeroOffset;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)((ulong)bufferCreateInfo.pQueueFamilyIndices & 0xffffffff00000000);
  depthAttachmentReference.attachment = 0xffffffff;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  bufferCreateInfo._40_8_ = &bufferCreateInfo_1;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexInputStateInfo,vk,device,
             (VkRenderPassCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar8 = vertexInputStateInfo.pVertexBindingDescriptions;
  uVar14 = vertexInputStateInfo._16_8_;
  pvVar7 = vertexInputStateInfo.pNext;
  pMVar6 = local_240;
  this_04 = local_248;
  attachmentBindInfos[0].m_internal = (VkImageView)(VkImageView)vertexInputStateInfo._0_8_;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateInfo._4_4_ = 0;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.vertexBindingDescriptionCount = 0;
  vertexInputStateInfo.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&local_240->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_device =
       (VkDevice)uVar14;
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar8;
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       (deUint64)attachmentBindInfos[0].m_internal;
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)pvVar7;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&vertexInputStateInfo);
  attachmentBindInfos[0].m_internal =
       (VkImageView)
       (this->m_colorImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1._16_8_ = bufferCreateInfo_1._16_8_ & 0xffffffff00000000;
  dVar3 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
          m_internal;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)dVar3;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(dVar3 >> 0x20);
  uVar14 = *(undefined8 *)(this->super_DrawContext).m_drawState.renderSize.m_data;
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = (undefined4)uVar14;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = (undefined4)((ulong)uVar14 >> 0x20);
  bufferCreateInfo_1.usage = 1;
  bufferCreateInfo_1._40_8_ = attachmentBindInfos;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&zeroOffset,vk,device,
             (VkFramebufferCreateInfo *)&bufferCreateInfo_1,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo._16_8_ = local_278;
  bufferCreateInfo.size = (VkDeviceSize)pVStack_270;
  bufferCreateInfo._0_8_ = zeroOffset;
  bufferCreateInfo.pNext = pDStack_280;
  zeroOffset = 0;
  pDStack_280 = (DeviceInterface *)0x0;
  local_278 = (VkDevice)0x0;
  pVStack_270 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&this_04->super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  (this_04->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  (this_04->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferCreateInfo.size;
  (this_04->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  (this_04->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&zeroOffset);
  vertexInputStateInfo.pVertexBindingDescriptions = &bindingDesc;
  bindingDesc.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  bindingDesc.binding = 0;
  bindingDesc.stride = 0x10;
  vertexInputStateInfo.pVertexAttributeDescriptions = &attributeDesc;
  attributeDesc.location = 0;
  attributeDesc.binding = 0;
  attributeDesc.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  attributeDesc.offset = 0;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.vertexBindingDescriptionCount = 1;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineTessellationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  pipelineTessellationStateInfo.pNext = (void *)0x0;
  pipelineTessellationStateInfo.flags = 0;
  pipelineInputAssemblyStateInfo._16_8_ =
       (ulong)(this->super_DrawContext).m_drawState.topology << 0x20;
  pipelineTessellationStateInfo.patchControlPoints =
       (this->super_DrawContext).m_drawState.numPatchControlPoints;
  colorAttachmentReference.attachment = 0x16;
  zeroOffset = CONCAT44(zeroOffset._4_4_,0x17);
  pDStack_280 = (DeviceInterface *)0x0;
  local_278 = (VkDevice)((ulong)(this->super_DrawContext).m_drawState.depthClampEnable << 0x20);
  pVStack_270 = (VkAllocationCallbacks *)0x0;
  local_268 = 0;
  local_260 = 0;
  uStack_258 = 0;
  local_250 = (this->super_DrawContext).m_drawState.lineWidth;
  depthAttachmentReference.attachment = 0x18;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0x100000000;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  attachmentBindInfos[0].m_internal._0_4_ = 0x1a;
  shaderStages.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderStages.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  shaderStages.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar12 = 0;
  vertexInputStateInfo.vertexAttributeDescriptionCount = 1;
  while( true ) {
    uVar13 = (ulong)uVar12;
    pvVar4 = (this->m_program).shaders;
    pSVar5 = (pvVar4->
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar4->
                      super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 4) <= uVar13)
    break;
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_228,vk,device,pSVar5[uVar13].binary,0
              );
    bufferCreateInfo_1._16_8_ = local_228.m_data.deleter.m_device;
    bufferCreateInfo_1.size._0_4_ = (VkFormat)local_228.m_data.deleter.m_allocator;
    bufferCreateInfo_1.size._4_4_ =
         (undefined4)((ulong)local_228.m_data.deleter.m_allocator >> 0x20);
    bufferCreateInfo_1._0_8_ = local_228.m_data.object.m_internal;
    bufferCreateInfo_1.pNext = local_228.m_data.deleter.m_deviceIface;
    local_228.m_data.object.m_internal = 0;
    local_228.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_228.m_data.deleter.m_device = (VkDevice)0x0;
    local_228.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    this_08 = this->m_shaderModules + uVar13;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
              (&this_08->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    (this_08->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
         (VkDevice)bufferCreateInfo_1._16_8_;
    (this_08->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(bufferCreateInfo_1.size._4_4_,(VkFormat)bufferCreateInfo_1.size);
    (this_08->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         bufferCreateInfo_1._0_8_;
    (this_08->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)bufferCreateInfo_1.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_228);
    bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    bufferCreateInfo_1.pNext = (void *)0x0;
    bufferCreateInfo_1._16_8_ =
         (ulong)(((this->m_program).shaders)->
                super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar13].stage << 0x20;
    dVar3 = (this_08->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
    bufferCreateInfo_1.size._0_4_ = (VkFormat)dVar3;
    bufferCreateInfo_1.size._4_4_ = (undefined4)(dVar3 >> 0x20);
    bufferCreateInfo_1.usage = 0x989565;
    bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    bufferCreateInfo_1.queueFamilyIndexCount = 0;
    bufferCreateInfo_1._44_4_ = 0;
    std::
    vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
    ::push_back(&shaderStages,(value_type *)&bufferCreateInfo_1);
    uVar12 = uVar12 + 1;
  }
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  bufferCreateInfo_1._16_8_ =
       ((long)shaderStages.
              super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)shaderStages.
             super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x30 << 0x20;
  bufferCreateInfo_1.size._0_4_ =
       (VkFormat)
       shaderStages.
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo_1.size._4_4_ =
       (undefined4)
       ((ulong)shaderStages.
               super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  bufferCreateInfo_1._32_8_ = &vertexInputStateInfo;
  bufferCreateInfo_1._40_8_ = &pipelineInputAssemblyStateInfo;
  pVVar11 = &pipelineTessellationStateInfo;
  if ((this->super_DrawContext).m_drawState.topology != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST) {
    pVVar11 = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = SUB84(pVVar11,0);
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = (undefined4)((ulong)pVVar11 >> 0x20);
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_1c8,vk,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&bufferCreateInfo_1,(VkAllocationCallbacks *)0x0);
  local_228.m_data.deleter.m_device = local_1c8.m_data.deleter.m_device;
  local_228.m_data.deleter.m_allocator = local_1c8.m_data.deleter.m_allocator;
  local_228.m_data.object.m_internal = local_1c8.m_data.object.m_internal;
  local_228.m_data.deleter.m_deviceIface = local_1c8.m_data.deleter.m_deviceIface;
  local_1c8.m_data.object.m_internal = 0;
  local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_228.m_data.deleter.m_device;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_228.m_data.deleter.m_allocator;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
       local_228.m_data.object.m_internal;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_228.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_1c8);
  std::
  _Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::~_Vector_base(&shaderStages.
                   super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                 );
  zeroOffset = 0;
  beginCommandBuffer(vk,(this_03->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x3f80000000000000;
  uVar14 = *(undefined8 *)(this->super_DrawContext).m_drawState.renderSize.m_data;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1._16_8_ =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  dVar3 = (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
          m_internal;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)dVar3;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(dVar3 >> 0x20);
  bufferCreateInfo_1.usage = 0;
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = (deUint32)uVar14;
  bufferCreateInfo_1._44_4_ = SUB84((ulong)uVar14 >> 0x20,0);
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 1;
  (*vk->_vptr_DeviceInterface[0x74])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             &bufferCreateInfo_1,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,(this_03->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,
             (this_01->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,(this_03->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,1,
             (this->m_vertexBuffer).
             super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
             m_data.ptr,&zeroOffset);
  pvVar2 = (this->super_DrawContext).m_drawCallData.vertices;
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)((long)(pvVar2->
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar2->
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 4,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])
            (vk,(this_03->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  uVar14 = (((this->m_colorImage).
             super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>.m_data.
            ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 0x100;
  bufferCreateInfo_1._20_4_ = 0x800;
  bufferCreateInfo_1.size._0_4_ = 2;
  bufferCreateInfo_1.size._4_4_ = 6;
  bufferCreateInfo_1.usage = 0xffffffff;
  bufferCreateInfo_1.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = (deUint32)uVar14;
  bufferCreateInfo_1._44_4_ = SUB84((ulong)uVar14 >> 0x20,0);
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(this_03->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x400,0x1000,0,0,0,0
             ,0,1,&bufferCreateInfo_1);
  uVar14 = *(undefined8 *)(this->super_DrawContext).m_drawState.renderSize.m_data;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo_1._4_4_ = 0;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 1;
  bufferCreateInfo_1._20_4_ = 0;
  bufferCreateInfo_1.size._0_4_ = 0;
  bufferCreateInfo_1.size._4_4_ = 1;
  bufferCreateInfo_1.usage = 0;
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1._44_4_ = SUB84(uVar14,0);
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = (undefined4)((ulong)uVar14 >> 0x20);
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 1;
  (*vk->_vptr_DeviceInterface[99])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (deUint64)
             (((this->m_colorImage).
               super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>.
               m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object,6,
             (deUint64)
             (((this->m_colorAttachmentBuffer).
               super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
               m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object,1,
             &bufferCreateInfo_1);
  uVar14 = (((this_00->
             super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
             m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 0x1000;
  bufferCreateInfo_1._20_4_ = 0x2000;
  bufferCreateInfo_1.size._0_4_ = 0xffffffff;
  bufferCreateInfo_1.size._4_4_ = 0xffffffff;
  bufferCreateInfo_1.usage = (VkBufferUsageFlags)uVar14;
  bufferCreateInfo_1.sharingMode = (VkSharingMode)((ulong)uVar14 >> 0x20);
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1._44_4_ = 0;
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 0xffffffff;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 0xffffffff;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(this_03->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,0x4000,0,0,0,
             1,(int)&bufferCreateInfo_1,0,0);
  endCommandBuffer(vk,(this_03->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  return;
}

Assistant:

VulkanDrawContext::VulkanDrawContext (  Context&				context,
										const DrawState&		drawState,
										const DrawCallData&		drawCallData,
										const VulkanProgram&	vulkanProgram)
	: DrawContext						(drawState, drawCallData)
	, m_context							(context)
	, m_program							(vulkanProgram)
{
	const DeviceInterface&	vk						= m_context.getDeviceInterface();
	const VkDevice			device					= m_context.getDevice();
	Allocator&				allocator				= m_context.getDefaultAllocator();
	VkImageSubresourceRange	colorSubresourceRange;

	// Command buffer
	{
		m_cmdPool			= makeCommandPool(vk, device, m_context.getUniversalQueueFamilyIndex());
		m_cmdBuffer			= makeCommandBuffer(vk, device, *m_cmdPool);
	}

	// Color attachment image
	{
		const VkImageUsageFlags usage			= VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
		colorSubresourceRange					= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		const VkImageCreateInfo	imageCreateInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,										// VkStructureType			sType;
			DE_NULL,																	// const void*				pNext;
			(VkImageCreateFlags)0,														// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,															// VkImageType				imageType;
			m_drawState.colorFormat,													// VkFormat					format;
			makeExtent3D(m_drawState.renderSize.x(), m_drawState.renderSize.y(), 1u),	// VkExtent3D				extent;
			1u,																			// uint32_t					mipLevels;
			1u,																			// uint32_t					arrayLayers;
			VK_SAMPLE_COUNT_1_BIT,														// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,													// VkImageTiling			tiling;
			usage,																		// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,													// VkSharingMode			sharingMode;
			VK_QUEUE_FAMILY_IGNORED,													// uint32_t					queueFamilyIndexCount;
			DE_NULL,																	// const uint32_t*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED,													// VkImageLayout			initialLayout;
		};

		m_colorImage = MovePtr<ImageWithMemory>(new ImageWithMemory(vk, device, allocator, imageCreateInfo, MemoryRequirement::Any));
		m_colorImageView = makeImageView(vk, device, **m_colorImage, VK_IMAGE_VIEW_TYPE_2D, m_drawState.colorFormat, colorSubresourceRange);

		// Buffer to copy attachment data after rendering

		const VkDeviceSize bitmapSize = tcu::getPixelSize(mapVkFormat(m_drawState.colorFormat)) * m_drawState.renderSize.x() * m_drawState.renderSize.y();
		m_colorAttachmentBuffer = MovePtr<BufferWithMemory>(new BufferWithMemory(
			vk, device, allocator, makeBufferCreateInfo(bitmapSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible));

		{
			const Allocation& alloc = m_colorAttachmentBuffer->getAllocation();
			deMemset(alloc.getHostPtr(), 0, (size_t)bitmapSize);
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), bitmapSize);
		}
	}

	// Vertex buffer
	{
		const VkDeviceSize bufferSize = m_drawCallData.vertices.size() * sizeof(m_drawCallData.vertices[0]);
		m_vertexBuffer = MovePtr<BufferWithMemory>(new BufferWithMemory(
			vk, device, allocator, makeBufferCreateInfo(bufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible));

		const Allocation& alloc = m_vertexBuffer->getAllocation();
		deMemcpy(alloc.getHostPtr(), &m_drawCallData.vertices[0], (size_t)bufferSize);
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), bufferSize);
	}

	// Pipeline layout
	{
		m_pipelineLayout = makePipelineLayoutWithoutDescriptors(vk, device);
	}

	// Renderpass
	{
		const VkAttachmentDescription colorAttachmentDescription =
		{
			(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
			m_drawState.colorFormat,							// VkFormat							format;
			VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout					initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout					finalLayout;
		};

		const VkAttachmentReference colorAttachmentReference =
		{
			0u,													// deUint32			attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL			// VkImageLayout	layout;
		};

		const VkAttachmentReference depthAttachmentReference =
		{
			VK_ATTACHMENT_UNUSED,								// deUint32			attachment;
			VK_IMAGE_LAYOUT_UNDEFINED							// VkImageLayout	layout;
		};

		const VkSubpassDescription subpassDescription =
		{
			(VkSubpassDescriptionFlags)0,						// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&colorAttachmentReference,							// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,											// const VkAttachmentReference*		pResolveAttachments;
			&depthAttachmentReference,							// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL												// const deUint32*					pPreserveAttachments;
		};

		const VkRenderPassCreateInfo renderPassInfo =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			(VkRenderPassCreateFlags)0,							// VkRenderPassCreateFlags			flags;
			1u,													// deUint32							attachmentCount;
			&colorAttachmentDescription,						// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDescription,								// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL												// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass = createRenderPass(vk, device, &renderPassInfo);
	}

	// Framebuffer
	{
		const VkImageView attachmentBindInfos[] =
		{
			m_colorImageView.get()
		};

		const VkFramebufferCreateInfo framebufferInfo = {
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,		// VkStructureType						sType;
			DE_NULL,										// const void*							pNext;
			(VkFramebufferCreateFlags)0,					// VkFramebufferCreateFlags				flags;
			*m_renderPass,									// VkRenderPass							renderPass;
			DE_LENGTH_OF_ARRAY(attachmentBindInfos),		// uint32_t								attachmentCount;
			attachmentBindInfos,							// const VkImageView*					pAttachments;
			m_drawState.renderSize.x(),						// uint32_t								width;
			m_drawState.renderSize.y(),						// uint32_t								height;
			1u,												// uint32_t								layers;
		};

		m_framebuffer = createFramebuffer(vk, device, &framebufferInfo);
	}

	// Graphics pipeline
	{
		const deUint32	vertexStride	= sizeof(Vec4);
		const VkFormat	vertexFormat	= VK_FORMAT_R32G32B32A32_SFLOAT;

		DE_ASSERT(m_drawState.topology != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST || m_drawState.numPatchControlPoints > 0);

		const VkVertexInputBindingDescription bindingDesc =
		{
			0u,									// uint32_t				binding;
			vertexStride,						// uint32_t				stride;
			VK_VERTEX_INPUT_RATE_VERTEX,		// VkVertexInputRate	inputRate;
		};
		const VkVertexInputAttributeDescription attributeDesc =
		{
			0u,									// uint32_t			location;
			0u,									// uint32_t			binding;
			vertexFormat,						// VkFormat			format;
			0u,									// uint32_t			offset;
		};

		const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags		flags;
			1u,																// uint32_t										vertexBindingDescriptionCount;
			&bindingDesc,													// const VkVertexInputBindingDescription*		pVertexBindingDescriptions;
			1u,																// uint32_t										vertexAttributeDescriptionCount;
			&attributeDesc,													// const VkVertexInputAttributeDescription*		pVertexAttributeDescriptions;
		};

		const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags		flags;
			m_drawState.topology,											// VkPrimitiveTopology							topology;
			VK_FALSE,														// VkBool32										primitiveRestartEnable;
		};

		const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags		flags;
			m_drawState.numPatchControlPoints,								// uint32_t										patchControlPoints;
		};

		const VkViewport viewport = makeViewport(
			0.0f, 0.0f,
			static_cast<float>(m_drawState.renderSize.x()), static_cast<float>(m_drawState.renderSize.y()),
			0.0f, 1.0f);

		const VkRect2D scissor = {
			makeOffset2D(0, 0),
			makeExtent2D(m_drawState.renderSize.x(), m_drawState.renderSize.y()),
		};

		const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType									sType;
			DE_NULL,												// const void*										pNext;
			(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags				flags;
			1u,														// uint32_t											viewportCount;
			&viewport,												// const VkViewport*								pViewports;
			1u,														// uint32_t											scissorCount;
			&scissor,												// const VkRect2D*									pScissors;
		};

		const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags	flags;
			m_drawState.depthClampEnable,									// VkBool32									depthClampEnable;
			VK_FALSE,														// VkBool32									rasterizerDiscardEnable;
			VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
			VK_CULL_MODE_NONE,												// VkCullModeFlags							cullMode;
			VK_FRONT_FACE_COUNTER_CLOCKWISE,								// VkFrontFace								frontFace;
			VK_FALSE,														// VkBool32									depthBiasEnable;
			0.0f,															// float									depthBiasConstantFactor;
			0.0f,															// float									depthBiasClamp;
			0.0f,															// float									depthBiasSlopeFactor;
			m_drawState.lineWidth,											// float									lineWidth;
		};

		const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
			VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
			VK_FALSE,													// VkBool32									sampleShadingEnable;
			0.0f,														// float									minSampleShading;
			DE_NULL,													// const VkSampleMask*						pSampleMask;
			VK_FALSE,													// VkBool32									alphaToCoverageEnable;
			VK_FALSE													// VkBool32									alphaToOneEnable;
		};

		const VkStencilOpState stencilOpState = makeStencilOpState(
			VK_STENCIL_OP_KEEP,		// stencil fail
			VK_STENCIL_OP_KEEP,		// depth & stencil pass
			VK_STENCIL_OP_KEEP,		// depth only fail
			VK_COMPARE_OP_NEVER,	// compare op
			0u,						// compare mask
			0u,						// write mask
			0u);					// reference

		const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
			VK_FALSE,													// VkBool32									depthTestEnable;
			VK_FALSE,													// VkBool32									depthWriteEnable;
			VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
			VK_FALSE,													// VkBool32									depthBoundsTestEnable;
			VK_FALSE,													// VkBool32									stencilTestEnable;
			stencilOpState,												// VkStencilOpState							front;
			stencilOpState,												// VkStencilOpState							back;
			0.0f,														// float									minDepthBounds;
			1.0f,														// float									maxDepthBounds;
		};

		const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
		const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
		{
			m_drawState.blendEnable,			// VkBool32					blendEnable;
			VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
			VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
			VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
			VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
			VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
			VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
			colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
		};

		const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
			DE_NULL,													// const void*									pNext;
			(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
			VK_FALSE,													// VkBool32										logicOpEnable;
			VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
			1u,															// deUint32										attachmentCount;
			&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
			{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
		};

		// Create shader stages

		std::vector<VkPipelineShaderStageCreateInfo>	shaderStages;
		VkShaderStageFlags								stageFlags = (VkShaderStageFlags)0;

		DE_ASSERT(m_program.shaders.size() <= MAX_NUM_SHADER_MODULES);
		for (deUint32 shaderNdx = 0; shaderNdx < m_program.shaders.size(); ++shaderNdx)
		{
			m_shaderModules[shaderNdx] = createShaderModule(vk, device, *m_program.shaders[shaderNdx].binary, (VkShaderModuleCreateFlags)0);

			const VkPipelineShaderStageCreateInfo pipelineShaderStageInfo =
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
				DE_NULL,												// const void*							pNext;
				(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
				m_program.shaders[shaderNdx].stage,						// VkShaderStageFlagBits				stage;
				*m_shaderModules[shaderNdx],							// VkShaderModule						module;
				"main",													// const char*							pName;
				DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
			};

			shaderStages.push_back(pipelineShaderStageInfo);
			stageFlags |= m_program.shaders[shaderNdx].stage;
		}

		DE_ASSERT(
			(m_drawState.topology != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST) ||
			(stageFlags & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)));

		const bool tessellationEnabled = (m_drawState.topology == VK_PRIMITIVE_TOPOLOGY_PATCH_LIST);
		const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
		{
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
			DE_NULL,																// const void*										pNext;
			(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
			static_cast<deUint32>(shaderStages.size()),								// deUint32											stageCount;
			&shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
			&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
			&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
			(tessellationEnabled ? &pipelineTessellationStateInfo : DE_NULL),		// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
			&pipelineViewportStateInfo,												// const VkPipelineViewportStateCreateInfo*			pViewportState;
			&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
			&pipelineMultisampleStateInfo,											// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
			&pipelineDepthStencilStateInfo,											// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
			&pipelineColorBlendStateInfo,											// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
			DE_NULL,																// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
			*m_pipelineLayout,														// VkPipelineLayout									layout;
			*m_renderPass,															// VkRenderPass										renderPass;
			0u,																		// deUint32											subpass;
			DE_NULL,																// VkPipeline										basePipelineHandle;
			0,																		// deInt32											basePipelineIndex;
		};

		m_pipeline = createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
	}

	// Record commands
	{
		const VkDeviceSize zeroOffset = 0ull;

		beginCommandBuffer(vk, *m_cmdBuffer);

		// Begin render pass
		{
			const VkClearValue	clearValue = makeClearValueColor(Vec4(0.0f, 0.0f, 0.0f, 1.0f));
			const VkRect2D		renderArea =
			{
				makeOffset2D(0, 0),
				makeExtent2D(m_drawState.renderSize.x(), m_drawState.renderSize.y())
			};

			const VkRenderPassBeginInfo renderPassBeginInfo = {
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,							// VkStructureType								sType;
				DE_NULL,															// const void*									pNext;
				*m_renderPass,														// VkRenderPass									renderPass;
				*m_framebuffer,														// VkFramebuffer								framebuffer;
				renderArea,															// VkRect2D										renderArea;
				1u,																	// uint32_t										clearValueCount;
				&clearValue,														// const VkClearValue*							pClearValues;
			};

			vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
		}

		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &(**m_vertexBuffer), &zeroOffset);

		vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_drawCallData.vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*m_cmdBuffer);

		// Barrier: draw -> copy from image
		{
			const VkImageMemoryBarrier barrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				**m_colorImage, colorSubresourceRange);

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, 1u, &barrier);
		}

		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u),
					makeExtent3D(m_drawState.renderSize.x(), m_drawState.renderSize.y(), 1u));
			vk.cmdCopyImageToBuffer(*m_cmdBuffer, **m_colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **m_colorAttachmentBuffer, 1u, &copyRegion);
		}

		// Barrier: copy to buffer -> host read
		{
			const VkBufferMemoryBarrier barrier = makeBufferMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT,
				**m_colorAttachmentBuffer, 0ull, VK_WHOLE_SIZE);

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *m_cmdBuffer);
	}
}